

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowConstantAggregatorLocalState::Sink
          (WindowConstantAggregatorLocalState *this,DataChunk *sink_chunk,DataChunk *coll_chunk,
          idx_t row,optional_ptr<duckdb::SelectionVector,_true> filter_sel,idx_t filtered)

{
  ulong *puVar1;
  WindowAggregator *pWVar2;
  sel_t *psVar3;
  idx_t iVar4;
  aggregate_simple_update_t p_Var5;
  Vector *pVVar6;
  ulong *puVar7;
  DataChunk *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  ulong *puVar8;
  type pVVar9;
  reference pvVar10;
  const_reference pvVar11;
  reference pvVar12;
  FunctionDataWrapper *pFVar13;
  ulong uVar14;
  long lVar15;
  value_type vVar16;
  ulong uVar17;
  size_type sVar18;
  ulong uVar19;
  idx_t iVar20;
  idx_t iVar21;
  WindowConstantAggregatorGlobalState *pWVar22;
  DataChunk *chunk;
  idx_t iVar23;
  WindowConstantAggregatorLocalState *pWVar24;
  size_type __n;
  ulong uVar25;
  SelectionVector sel;
  AggregateInputData aggr_input_data;
  optional_ptr<duckdb::SelectionVector,_true> local_f8;
  size_type local_f0;
  ulong local_e8;
  WindowConstantAggregatorLocalState *local_e0;
  DataChunk *local_d8;
  idx_t local_d0;
  idx_t local_c8;
  WindowConstantAggregatorGlobalState *local_c0;
  idx_t local_b8;
  ulong local_b0;
  SelectionVector local_a8;
  vector<unsigned_long,_true> *local_88;
  DataChunk *local_80;
  Vector *local_78;
  data_ptr_t local_70;
  idx_t local_68;
  data_ptr_t local_60;
  value_type local_58;
  value_type local_50;
  AggregateInputData local_48;
  
  local_c0 = this->gstate;
  puVar1 = (local_c0->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
           .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = puVar1;
  uVar19 = (long)(local_c0->partition_offsets).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  while (puVar7 = puVar8, 0 < (long)uVar19) {
    uVar17 = uVar19 >> 1;
    uVar19 = ~uVar17 + uVar19;
    puVar8 = puVar7 + uVar17 + 1;
    if (row < puVar7[uVar17]) {
      puVar8 = puVar7;
      uVar19 = uVar17;
    }
  }
  local_b0 = sink_chunk->count + row;
  local_f0 = (long)puVar7 - (long)puVar1;
  local_f8.ptr = filter_sel.ptr;
  local_d0 = row;
  local_b8 = filtered;
  pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&(this->statef).statef);
  local_60 = pVVar9->data;
  local_70 = (this->statep).data;
  pWVar2 = (this->gstate->super_WindowAggregatorGlobalState).aggregator;
  local_e0 = this;
  if ((pWVar2->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pWVar2->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar18 = 0;
    do {
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&(this->payload_chunk).data,sVar18);
      pvVar11 = vector<unsigned_long,_true>::operator[](&pWVar2->child_idx,sVar18);
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&sink_chunk->data,*pvVar11);
      Vector::Reference(pvVar10,pvVar12);
      sVar18 = sVar18 + 1;
    } while (sVar18 < (ulong)((long)(pWVar2->child_idx).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pWVar2->child_idx).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  __n = (long)local_f0 >> 3;
  local_88 = &local_c0->partition_offsets;
  if ((local_c0->super_WindowAggregatorGlobalState).aggr.bind_data_wrapper.internal.
      super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_48.bind_data.ptr = (FunctionData *)0x0;
  }
  else {
    pFVar13 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                        (&(local_c0->super_WindowAggregatorGlobalState).aggr.bind_data_wrapper);
    local_48.bind_data.ptr =
         (pFVar13->function_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  iVar4 = local_d0;
  pWVar24 = local_e0;
  local_48.allocator =
       &(local_e0->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
  local_48.combine_type = PRESERVE_INPUT;
  local_f0 = __n;
  pvVar11 = vector<unsigned_long,_true>::operator[](local_88,__n);
  if (iVar4 < local_b0) {
    local_f0 = local_f0 - 1;
    local_78 = &pWVar24->statep;
    local_d8 = &pWVar24->inputs;
    chunk = &pWVar24->payload_chunk;
    local_e8 = 0;
    uVar19 = 0;
    local_58 = local_d0;
    vVar16 = *pvVar11;
    local_80 = chunk;
    do {
      if (local_58 == vVar16) {
        lVar15 = local_f0 + 1;
        pvVar11 = vector<unsigned_long,_true>::operator[](local_88,local_f0 + 2);
        vVar16 = *pvVar11;
        local_f0 = lVar15;
      }
      iVar4 = local_b8;
      local_50 = vVar16;
      if (local_b0 <= vVar16) {
        local_50 = local_b0;
      }
      local_c8 = local_50 - local_d0;
      DataChunk::Reset(local_d8);
      iVar21 = local_c8;
      this_00 = local_d8;
      uVar17 = local_e8;
      if (local_f8.ptr == (SelectionVector *)0x0) {
        local_68 = uVar19;
        if (local_e8 == 0) {
          DataChunk::Reference(local_d8,chunk);
          uVar17 = local_e8;
          iVar21 = local_c8;
        }
        else if ((pWVar24->payload_chunk).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish !=
                 (pWVar24->payload_chunk).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start) {
          sVar18 = 0;
          do {
            pvVar10 = vector<duckdb::Vector,_true>::operator[](&this_00->data,sVar18);
            pvVar12 = vector<duckdb::Vector,_true>::operator[](&local_80->data,sVar18);
            Vector::Slice(pvVar10,pvVar12,uVar17,iVar21);
            sVar18 = sVar18 + 1;
          } while (sVar18 < (ulong)(((long)(pWVar24->payload_chunk).data.
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pWVar24->payload_chunk).data.
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x4ec4ec4ec4ec4ec5));
        }
        (pWVar24->inputs).count = iVar21 - uVar17;
        pWVar22 = local_c0;
        chunk = local_80;
        uVar19 = local_68;
      }
      else {
        local_a8.sel_vector = (sel_t *)0x0;
        local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uVar25 = uVar19;
        if (uVar19 < iVar4) {
          do {
            optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_f8);
            uVar14 = uVar19;
            if ((local_f8.ptr)->sel_vector != (sel_t *)0x0) {
              uVar14 = (ulong)(local_f8.ptr)->sel_vector[uVar19];
            }
            uVar25 = uVar19;
          } while ((uVar14 < uVar17) && (uVar19 = uVar19 + 1, uVar25 = iVar4, iVar4 != uVar19));
        }
        optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_f8);
        this_01._M_pi =
             local_a8.selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        psVar3 = (local_f8.ptr)->sel_vector;
        local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
        iVar23 = 0;
        iVar20 = iVar4 - uVar25;
        iVar21 = iVar23;
        uVar19 = uVar25;
        local_a8.sel_vector = psVar3 + uVar25;
        if (uVar25 <= iVar4 && iVar20 != 0) {
          do {
            optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_f8);
            if ((local_f8.ptr)->sel_vector == (sel_t *)0x0) {
              uVar19 = uVar25 + iVar23;
            }
            else {
              uVar19 = (ulong)(local_f8.ptr)->sel_vector[uVar25 + iVar23];
            }
            if (local_c8 <= uVar19) {
              iVar21 = iVar23;
              uVar19 = uVar25 + iVar23;
              break;
            }
            iVar23 = iVar23 + 1;
            iVar21 = iVar20;
            uVar19 = local_b8;
          } while (iVar20 != iVar23);
        }
        pWVar22 = local_c0;
        if (iVar21 != (local_e0->inputs).count) {
          DataChunk::Slice(local_d8,chunk,&local_a8,iVar21,0);
        }
        pWVar24 = local_e0;
        if (local_a8.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          pWVar24 = local_e0;
        }
      }
      iVar4 = (pWVar24->inputs).count;
      p_Var5 = (pWVar22->super_WindowAggregatorGlobalState).aggr.function.simple_update;
      if (p_Var5 == (aggregate_simple_update_t)0x0) {
        *(data_ptr_t *)local_70 = *(data_ptr_t *)(local_60 + local_f0 * 8);
        pVVar6 = (pWVar24->inputs).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*(pWVar22->super_WindowAggregatorGlobalState).aggr.function.update)
                  (pVVar6,&local_48,
                   ((long)(pWVar24->inputs).data.
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 3) *
                   0x4ec4ec4ec4ec4ec5,local_78,iVar4);
      }
      else {
        pVVar6 = (pWVar24->inputs).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*p_Var5)(pVVar6,&local_48,
                  ((long)(pWVar24->inputs).data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar6 >> 3) *
                  0x4ec4ec4ec4ec4ec5,*(data_ptr_t *)(local_60 + local_f0 * 8),iVar4);
      }
      lVar15 = local_58 - local_e8;
      local_e8 = local_c8;
      local_58 = lVar15 + local_c8;
      vVar16 = local_50;
    } while (local_58 < local_b0);
  }
  return;
}

Assistant:

void WindowConstantAggregatorLocalState::Sink(DataChunk &sink_chunk, DataChunk &coll_chunk, idx_t row,
                                              optional_ptr<SelectionVector> filter_sel, idx_t filtered) {
	auto &partition_offsets = gstate.partition_offsets;
	const auto &aggr = gstate.aggr;
	const auto chunk_begin = row;
	const auto chunk_end = chunk_begin + sink_chunk.size();
	idx_t partition =
	    idx_t(std::upper_bound(partition_offsets.begin(), partition_offsets.end(), row) - partition_offsets.begin()) -
	    1;

	auto state_f_data = statef.GetData();
	auto state_p_data = FlatVector::GetData<data_ptr_t>(statep);

	auto &child_idx = gstate.aggregator.child_idx;
	for (column_t c = 0; c < child_idx.size(); ++c) {
		payload_chunk.data[c].Reference(sink_chunk.data[child_idx[c]]);
	}

	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	idx_t begin = 0;
	idx_t filter_idx = 0;
	auto partition_end = partition_offsets[partition + 1];
	while (row < chunk_end) {
		if (row == partition_end) {
			++partition;
			partition_end = partition_offsets[partition + 1];
		}
		partition_end = MinValue(partition_end, chunk_end);
		auto end = partition_end - chunk_begin;

		inputs.Reset();
		if (filter_sel) {
			// 	Slice to any filtered rows in [begin, end)
			SelectionVector sel;

			//	Find the first value in [begin, end)
			for (; filter_idx < filtered; ++filter_idx) {
				auto idx = filter_sel->get_index(filter_idx);
				if (idx >= begin) {
					break;
				}
			}

			//	Find the first value in [end, filtered)
			sel.Initialize(filter_sel->data() + filter_idx);
			idx_t nsel = 0;
			for (; filter_idx < filtered; ++filter_idx, ++nsel) {
				auto idx = filter_sel->get_index(filter_idx);
				if (idx >= end) {
					break;
				}
			}

			if (nsel != inputs.size()) {
				inputs.Slice(payload_chunk, sel, nsel);
			}
		} else {
			//	Slice to [begin, end)
			if (begin) {
				for (idx_t c = 0; c < payload_chunk.ColumnCount(); ++c) {
					inputs.data[c].Slice(payload_chunk.data[c], begin, end);
				}
			} else {
				inputs.Reference(payload_chunk);
			}
			inputs.SetCardinality(end - begin);
		}

		//	Aggregate the filtered rows into a single state
		const auto count = inputs.size();
		auto state = state_f_data[partition];
		if (aggr.function.simple_update) {
			aggr.function.simple_update(inputs.data.data(), aggr_input_data, inputs.ColumnCount(), state, count);
		} else {
			state_p_data[0] = state_f_data[partition];
			aggr.function.update(inputs.data.data(), aggr_input_data, inputs.ColumnCount(), statep, count);
		}

		//	Skip filtered rows too!
		row += end - begin;
		begin = end;
	}
}